

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O2

any * Omega_h::anon_unknown_41::lt(any *__return_storage_ptr__,any *lhs,any *rhs)

{
  bool bVar1;
  type_info *ptVar2;
  ParserFail *this;
  double dVar3;
  allocator local_69;
  double local_68;
  Write<double> local_60;
  Write<double> local_50;
  string local_40;
  
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar2 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar2 = (*lhs->vtable->type)();
  }
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&double::typeinfo);
  if (bVar1) {
    local_68 = any_cast<double>(lhs);
    dVar3 = any_cast<double>(rhs);
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<bool>()::table;
    *(bool *)&__return_storage_ptr__->storage = local_68 < dVar3;
  }
  else {
    if (lhs->vtable == (vtable_type *)0x0) {
      ptVar2 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar2 = (*lhs->vtable->type)();
    }
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
    if (!bVar1) {
      this = (ParserFail *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_40,"Invalid operand types to < operator",&local_69);
      ParserFail::ParserFail(this,&local_40);
      __cxa_throw(this,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    any_cast<Omega_h::Read<double>>((Omega_h *)&local_50,lhs);
    any_cast<Omega_h::Read<double>>((Omega_h *)&local_60,rhs);
    lt_each<double>((Omega_h *)&local_40,(Read<double> *)&local_50,(Read<double> *)&local_60);
    any::construct<Omega_h::Read<signed_char>>
              (__return_storage_ptr__,(Read<signed_char> *)&local_40);
    Write<signed_char>::~Write((Write<signed_char> *)&local_40);
    Write<double>::~Write(&local_60);
    Write<double>::~Write(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

any lt(any& lhs, any& rhs) {
  if (lhs.type() == typeid(Real)) {
    return any_cast<Real>(lhs) < any_cast<Real>(rhs);
  } else if (lhs.type() == typeid(Reals)) {
    return lt_each(any_cast<Reals>(lhs), any_cast<Reals>(rhs));
  } else {
    throw ParserFail("Invalid operand types to < operator");
  }
}